

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserErrors
xmlParseInNodeContext(xmlNodePtr node,char *data,int datalen,int options,xmlNodePtr *lst)

{
  xmlElementType xVar1;
  long lVar2;
  _xmlNode *p_Var3;
  xmlCharEncodingHandlerPtr handler;
  xmlNodePtr cur_00;
  xmlChar *pxVar4;
  bool bVar5;
  xmlChar *local_78;
  xmlChar *ihref;
  xmlChar *iprefix;
  xmlNsPtr ns;
  xmlCharEncodingHandlerPtr hdlr;
  xmlParserErrors ret;
  int nsnr;
  xmlNodePtr cur;
  xmlNodePtr fake;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  xmlNodePtr *lst_local;
  int options_local;
  int datalen_local;
  char *data_local;
  xmlNodePtr node_local;
  
  hdlr._4_4_ = 0;
  if ((((lst == (xmlNodePtr *)0x0) || (node == (xmlNodePtr)0x0)) || (data == (char *)0x0)) ||
     (datalen < 0)) {
    node_local._4_4_ = XML_ERR_INTERNAL_ERROR;
  }
  else {
    xVar1 = node->type;
    data_local = (char *)node;
    if (((xVar1 - XML_ELEMENT_NODE < 5) || (xVar1 - XML_PI_NODE < 3)) ||
       (xVar1 == XML_HTML_DOCUMENT_NODE)) {
      while( true ) {
        bVar5 = false;
        if (((data_local != (char *)0x0) && (bVar5 = false, *(int *)(data_local + 8) != 1)) &&
           (bVar5 = false, *(int *)(data_local + 8) != 9)) {
          bVar5 = *(int *)(data_local + 8) != 0xd;
        }
        if (!bVar5) break;
        data_local = *(char **)(data_local + 0x28);
      }
      if (data_local == (char *)0x0) {
        node_local._4_4_ = XML_ERR_INTERNAL_ERROR;
      }
      else {
        if (*(int *)(data_local + 8) == 1) {
          fake = *(xmlNodePtr *)(data_local + 0x40);
        }
        else {
          fake = (xmlNodePtr)data_local;
        }
        if (fake == (xmlNodePtr)0x0) {
          node_local._4_4_ = XML_ERR_INTERNAL_ERROR;
        }
        else {
          if (fake->type == XML_DOCUMENT_NODE) {
            doc = (xmlDocPtr)xmlCreateMemoryParserCtxt(data,datalen);
            lst_local._0_4_ = options;
          }
          else {
            if (fake->type != XML_HTML_DOCUMENT_NODE) {
              return XML_ERR_INTERNAL_ERROR;
            }
            doc = (xmlDocPtr)htmlCreateMemoryParserCtxt(data,datalen);
            lst_local._0_4_ = options | 0x2000;
          }
          if (doc == (xmlDocPtr)0x0) {
            node_local._4_4_ = XML_ERR_NO_MEMORY;
          }
          else {
            if (fake[1].last == (_xmlNode *)0x0) {
              lst_local._0_4_ = (uint)lst_local | 0x1000;
            }
            else {
              if (doc[2].version != (xmlChar *)0x0) {
                xmlDictFree((xmlDictPtr)doc[2].version);
              }
              doc[2].version = (xmlChar *)fake[1].last;
            }
            lVar2._0_2_ = fake->line;
            lVar2._2_2_ = fake->extra;
            lVar2._4_4_ = *(undefined4 *)&fake->field_0x74;
            if (lVar2 != 0) {
              if (doc->parent != (_xmlNode *)0x0) {
                (*xmlFree)(doc->parent);
              }
              p_Var3 = (_xmlNode *)xmlStrdup(*(xmlChar **)&fake->line);
              doc->parent = p_Var3;
              handler = xmlFindCharEncodingHandler(*(char **)&fake->line);
              if (handler == (xmlCharEncodingHandlerPtr)0x0) {
                return XML_ERR_UNSUPPORTED_ENCODING;
              }
              xmlSwitchToEncoding((xmlParserCtxtPtr)doc,handler);
            }
            xmlCtxtUseOptionsInternal((xmlParserCtxtPtr)doc,(uint)lst_local,(char *)0x0);
            xmlDetectSAX2((xmlParserCtxtPtr)doc);
            doc->name = (char *)fake;
            *(undefined4 *)&doc[4].last = 2;
            *(undefined4 *)&doc[1].oldNs = 7;
            cur_00 = xmlNewDocComment(*(xmlDocPtr *)(data_local + 0x40),(xmlChar *)0x0);
            if (cur_00 == (xmlNodePtr)0x0) {
              xmlFreeParserCtxt((xmlParserCtxtPtr)doc);
              node_local._4_4_ = XML_ERR_NO_MEMORY;
            }
            else {
              xmlAddChild((xmlNodePtr)data_local,cur_00);
              if (*(int *)(data_local + 8) == 1) {
                nodePush((xmlParserCtxtPtr)doc,(xmlNodePtr)data_local);
                _ret = (_xmlNode *)data_local;
                while( true ) {
                  bVar5 = false;
                  if (_ret != (_xmlNode *)0x0) {
                    bVar5 = *(int *)((long)_ret + 8) == 1;
                  }
                  if (!bVar5) break;
                  for (iprefix = *(xmlChar **)((long)_ret + 0x60); iprefix != (xmlChar *)0x0;
                      iprefix = *(xmlChar **)iprefix) {
                    if (doc[2].version == (xmlChar *)0x0) {
                      ihref = *(xmlChar **)(iprefix + 0x18);
                      local_78 = *(xmlChar **)(iprefix + 0x10);
                    }
                    else {
                      ihref = xmlDictLookup((xmlDictPtr)doc[2].version,*(xmlChar **)(iprefix + 0x18)
                                            ,-1);
                      local_78 = xmlDictLookup((xmlDictPtr)doc[2].version,
                                               *(xmlChar **)(iprefix + 0x10),-1);
                    }
                    pxVar4 = xmlGetNamespace((xmlParserCtxtPtr)doc,ihref);
                    if (pxVar4 == (xmlChar *)0x0) {
                      nsPush((xmlParserCtxtPtr)doc,ihref,local_78);
                      hdlr._4_4_ = hdlr._4_4_ + 1;
                    }
                  }
                  _ret = *(_xmlNode **)((long)_ret + 0x28);
                }
              }
              if ((*(int *)((long)&doc->dict + 4) != 0) || (*(int *)((long)&doc->children + 4) != 0)
                 ) {
                *(uint *)&doc[2].intSubset = *(uint *)&doc[2].intSubset | 8;
              }
              if (fake->type == XML_HTML_DOCUMENT_NODE) {
                __htmlParseContent(doc);
              }
              else {
                xmlParseContent((xmlParserCtxtPtr)doc);
              }
              nsPop((xmlParserCtxtPtr)doc,hdlr._4_4_);
              if ((*(char *)&doc->prev->last->_private == '<') &&
                 (*(char *)((long)&doc->prev->last->_private + 1) == '/')) {
                xmlFatalErr((xmlParserCtxtPtr)doc,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
              }
              else if (*(char *)&doc->prev->last->_private != '\0') {
                xmlFatalErr((xmlParserCtxtPtr)doc,XML_ERR_EXTRA_CONTENT,(char *)0x0);
              }
              if ((doc->intSubset != (_xmlDtd *)0x0) && (doc->intSubset != (_xmlDtd *)data_local)) {
                xmlFatalErr((xmlParserCtxtPtr)doc,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
                *(undefined4 *)&doc->children = 0;
              }
              if (*(int *)&doc->children == 0) {
                if (*(int *)&doc->URL == 0) {
                  hdlr._0_4_ = XML_ERR_INTERNAL_ERROR;
                }
                else {
                  hdlr._0_4_ = *(xmlParserErrors *)&doc->URL;
                }
              }
              else {
                hdlr._0_4_ = XML_ERR_OK;
              }
              _ret = cur_00->next;
              cur_00->next = (_xmlNode *)0x0;
              *(xmlNodePtr *)(data_local + 0x20) = cur_00;
              if (_ret != (_xmlNode *)0x0) {
                _ret->prev = (_xmlNode *)0x0;
              }
              *lst = _ret;
              for (; _ret != (_xmlNode *)0x0; _ret = _ret->next) {
                _ret->parent = (_xmlNode *)0x0;
              }
              xmlUnlinkNode(cur_00);
              xmlFreeNode(cur_00);
              if ((xmlParserErrors)hdlr != XML_ERR_OK) {
                xmlFreeNodeList(*lst);
                *lst = (xmlNodePtr)0x0;
              }
              if (fake[1].last != (_xmlNode *)0x0) {
                doc[2].version = (xmlChar *)0x0;
              }
              xmlFreeParserCtxt((xmlParserCtxtPtr)doc);
              node_local._4_4_ = (xmlParserErrors)hdlr;
            }
          }
        }
      }
    }
    else {
      node_local._4_4_ = XML_ERR_INTERNAL_ERROR;
    }
  }
  return node_local._4_4_;
}

Assistant:

xmlParserErrors
xmlParseInNodeContext(xmlNodePtr node, const char *data, int datalen,
                      int options, xmlNodePtr *lst) {
#ifdef SAX2
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc = NULL;
    xmlNodePtr fake, cur;
    int nsnr = 0;

    xmlParserErrors ret = XML_ERR_OK;

    /*
     * check all input parameters, grab the document
     */
    if ((lst == NULL) || (node == NULL) || (data == NULL) || (datalen < 0))
        return(XML_ERR_INTERNAL_ERROR);
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    break;
	default:
	    return(XML_ERR_INTERNAL_ERROR);

    }
    while ((node != NULL) && (node->type != XML_ELEMENT_NODE) &&
           (node->type != XML_DOCUMENT_NODE) &&
	   (node->type != XML_HTML_DOCUMENT_NODE))
	node = node->parent;
    if (node == NULL)
	return(XML_ERR_INTERNAL_ERROR);
    if (node->type == XML_ELEMENT_NODE)
	doc = node->doc;
    else
        doc = (xmlDocPtr) node;
    if (doc == NULL)
	return(XML_ERR_INTERNAL_ERROR);

    /*
     * allocate a context and set-up everything not related to the
     * node position in the tree
     */
    if (doc->type == XML_DOCUMENT_NODE)
	ctxt = xmlCreateMemoryParserCtxt((char *) data, datalen);
#ifdef LIBXML_HTML_ENABLED
    else if (doc->type == XML_HTML_DOCUMENT_NODE) {
	ctxt = htmlCreateMemoryParserCtxt((char *) data, datalen);
        /*
         * When parsing in context, it makes no sense to add implied
         * elements like html/body/etc...
         */
        options |= HTML_PARSE_NOIMPLIED;
    }
#endif
    else
        return(XML_ERR_INTERNAL_ERROR);

    if (ctxt == NULL)
        return(XML_ERR_NO_MEMORY);

    /*
     * Use input doc's dict if present, else assure XML_PARSE_NODICT is set.
     * We need a dictionary for xmlDetectSAX2, so if there's no doc dict
     * we must wait until the last moment to free the original one.
     */
    if (doc->dict != NULL) {
        if (ctxt->dict != NULL)
	    xmlDictFree(ctxt->dict);
	ctxt->dict = doc->dict;
    } else
        options |= XML_PARSE_NODICT;

    if (doc->encoding != NULL) {
        xmlCharEncodingHandlerPtr hdlr;

        if (ctxt->encoding != NULL)
	    xmlFree((xmlChar *) ctxt->encoding);
        ctxt->encoding = xmlStrdup((const xmlChar *) doc->encoding);

        hdlr = xmlFindCharEncodingHandler((const char *) doc->encoding);
        if (hdlr != NULL) {
            xmlSwitchToEncoding(ctxt, hdlr);
	} else {
            return(XML_ERR_UNSUPPORTED_ENCODING);
        }
    }

    xmlCtxtUseOptionsInternal(ctxt, options, NULL);
    xmlDetectSAX2(ctxt);
    ctxt->myDoc = doc;
    /* parsing in context, i.e. as within existing content */
    ctxt->input_id = 2;
    ctxt->instate = XML_PARSER_CONTENT;

    fake = xmlNewDocComment(node->doc, NULL);
    if (fake == NULL) {
        xmlFreeParserCtxt(ctxt);
	return(XML_ERR_NO_MEMORY);
    }
    xmlAddChild(node, fake);

    if (node->type == XML_ELEMENT_NODE) {
	nodePush(ctxt, node);
	/*
	 * initialize the SAX2 namespaces stack
	 */
	cur = node;
	while ((cur != NULL) && (cur->type == XML_ELEMENT_NODE)) {
	    xmlNsPtr ns = cur->nsDef;
	    const xmlChar *iprefix, *ihref;

	    while (ns != NULL) {
		if (ctxt->dict) {
		    iprefix = xmlDictLookup(ctxt->dict, ns->prefix, -1);
		    ihref = xmlDictLookup(ctxt->dict, ns->href, -1);
		} else {
		    iprefix = ns->prefix;
		    ihref = ns->href;
		}

	        if (xmlGetNamespace(ctxt, iprefix) == NULL) {
		    nsPush(ctxt, iprefix, ihref);
		    nsnr++;
		}
		ns = ns->next;
	    }
	    cur = cur->parent;
	}
    }

    if ((ctxt->validate) || (ctxt->replaceEntities != 0)) {
	/*
	 * ID/IDREF registration will be done in xmlValidateElement below
	 */
	ctxt->loadsubset |= XML_SKIP_IDS;
    }

#ifdef LIBXML_HTML_ENABLED
    if (doc->type == XML_HTML_DOCUMENT_NODE)
        __htmlParseContent(ctxt);
    else
#endif
	xmlParseContent(ctxt);

    nsPop(ctxt, nsnr);
    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }
    if ((ctxt->node != NULL) && (ctxt->node != node)) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
	ctxt->wellFormed = 0;
    }

    if (!ctxt->wellFormed) {
        if (ctxt->errNo == 0)
	    ret = XML_ERR_INTERNAL_ERROR;
	else
	    ret = (xmlParserErrors)ctxt->errNo;
    } else {
        ret = XML_ERR_OK;
    }

    /*
     * Return the newly created nodeset after unlinking it from
     * the pseudo sibling.
     */

    cur = fake->next;
    fake->next = NULL;
    node->last = fake;

    if (cur != NULL) {
	cur->prev = NULL;
    }

    *lst = cur;

    while (cur != NULL) {
	cur->parent = NULL;
	cur = cur->next;
    }

    xmlUnlinkNode(fake);
    xmlFreeNode(fake);


    if (ret != XML_ERR_OK) {
        xmlFreeNodeList(*lst);
	*lst = NULL;
    }

    if (doc->dict != NULL)
        ctxt->dict = NULL;
    xmlFreeParserCtxt(ctxt);

    return(ret);
#else /* !SAX2 */
    return(XML_ERR_INTERNAL_ERROR);
#endif
}